

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld(DescriptorPool *this,string *name)

{
  int iVar1;
  FileDescriptor *__s;
  string *psVar2;
  FileOptions *pFVar3;
  SourceCodeInfo *pSVar4;
  FileDescriptorTables *this_00;
  
  __s = (FileDescriptor *)
        Tables::AllocateBytes
                  ((this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl,0xa0);
  memset(__s,0,0xa0);
  psVar2 = Tables::AllocateString
                     ((this->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl,name);
  *(string **)__s = psVar2;
  internal::InitProtobufDefaults();
  *(undefined8 **)(__s + 8) = &internal::fixed_address_empty_string_abi_cxx11_;
  *(DescriptorPool **)(__s + 0x10) = this;
  pFVar3 = FileOptions::default_instance();
  *(FileOptions **)(__s + 0x88) = pFVar3;
  if (FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables == '\0') {
    iVar1 = __cxa_guard_acquire(&FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables);
    if (iVar1 != 0) {
      this_00 = (FileDescriptorTables *)operator_new(0x1d8);
      FileDescriptorTables::FileDescriptorTables(this_00);
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::FileDescriptorTables>::
                 anon_class_1_0_00000001::__invoke,this_00);
      FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables = this_00;
      __cxa_guard_release(&FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables);
    }
  }
  *(FileDescriptorTables **)(__s + 0x90) =
       FileDescriptorTables::GetEmptyInstance()::file_descriptor_tables;
  pSVar4 = SourceCodeInfo::default_instance();
  *(SourceCodeInfo **)(__s + 0x98) = pSVar4;
  *(undefined2 *)(__s + 0x40) = 0x101;
  *(undefined4 *)(__s + 0x3c) = 2;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    const std::string& name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}